

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

void rnndec_freecontext(rnndeccontext *ctx)

{
  int local_14;
  int i;
  rnndeccontext *ctx_local;
  
  for (local_14 = 0; local_14 < ctx->varsnum; local_14 = local_14 + 1) {
    free(ctx->vars[local_14]);
  }
  free(ctx->vars);
  free(ctx);
  return;
}

Assistant:

void rnndec_freecontext(struct rnndeccontext *ctx) {
	int i;
	for (i = 0; i < ctx->varsnum; ++i)
		free(ctx->vars[i]);
	free(ctx->vars);
	free(ctx);
}